

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

bool icu_63::number::impl::GeneratorHelpers::unit
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  bool bVar1;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  MeasureUnit *unit;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  ConstChar16Ptr local_90;
  ConstChar16Ptr local_88;
  char16_t *local_80;
  char16_t *local_50;
  CurrencyUnit currency;
  
  unit = &macros->unit;
  bVar1 = utils::unitIsCurrency(unit);
  if (bVar1) {
    local_88.p_ = L"currency/";
    UnicodeString::append(sb,&local_88,-1);
    local_80 = local_88.p_;
    CurrencyUnit::CurrencyUnit(&currency,unit,status);
    bVar1 = *status < U_ILLEGAL_ARGUMENT_ERROR;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      blueprint_helpers::generateCurrencyOption(&currency,sb,extraout_RDX);
    }
    CurrencyUnit::~CurrencyUnit(&currency);
  }
  else {
    bVar1 = utils::unitIsNoUnit(unit);
    if (bVar1) {
      bVar1 = utils::unitIsPercent(unit);
      if (bVar1) {
        local_90.p_ = L"percent";
        UnicodeString::append(sb,&local_90,-1);
      }
      else {
        bVar1 = utils::unitIsPermille(unit);
        if (!bVar1) {
          return false;
        }
        local_98.p_ = L"permille";
        UnicodeString::append(sb,&local_98,-1);
      }
    }
    else {
      local_a0.p_ = L"measure-unit/";
      UnicodeString::append(sb,&local_a0,-1);
      local_50 = local_a0.p_;
      blueprint_helpers::generateMeasureUnitOption(unit,sb,extraout_RDX_00);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool GeneratorHelpers::unit(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (utils::unitIsCurrency(macros.unit)) {
        sb.append(u"currency/", -1);
        CurrencyUnit currency(macros.unit, status);
        if (U_FAILURE(status)) {
            return false;
        }
        blueprint_helpers::generateCurrencyOption(currency, sb, status);
        return true;
    } else if (utils::unitIsNoUnit(macros.unit)) {
        if (utils::unitIsPercent(macros.unit)) {
            sb.append(u"percent", -1);
            return true;
        } else if (utils::unitIsPermille(macros.unit)) {
            sb.append(u"permille", -1);
            return true;
        } else {
            // Default value is not shown in normalized form
            return false;
        }
    } else {
        sb.append(u"measure-unit/", -1);
        blueprint_helpers::generateMeasureUnitOption(macros.unit, sb, status);
        return true;
    }
}